

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edgeHeap.cpp
# Opt level: O1

Edge * __thiscall EdgeHeap::getMinCost(Edge *__return_storage_ptr__,EdgeHeap *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  pointer pEVar8;
  
  if ((this->pq).c.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      (this->pq).c.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    Edge::Edge(__return_storage_ptr__,0,0);
  }
  else {
    pEVar8 = (this->pq).c.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (this->isDeleted[pEVar8->id] == true) {
      do {
        std::priority_queue<Edge,_std::vector<Edge,_std::allocator<Edge>_>,_EdgeHeap::cmp>::pop
                  (&this->pq);
        pEVar8 = (this->pq).c.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (this->isDeleted[pEVar8->id] != false);
    }
    iVar4 = pEVar8->id;
    iVar5 = pEVar8->v1;
    iVar6 = pEVar8->v2;
    uVar7 = *(undefined4 *)&pEVar8->field_0xc;
    dVar1 = (pEVar8->v).x;
    dVar2 = *(double *)((long)&pEVar8->v + 8);
    dVar3 = pEVar8->costV;
    (__return_storage_ptr__->v).z = *(double *)((long)&pEVar8->v + 0x10);
    __return_storage_ptr__->costV = dVar3;
    (__return_storage_ptr__->v).x = dVar1;
    (__return_storage_ptr__->v).y = dVar2;
    __return_storage_ptr__->id = iVar4;
    __return_storage_ptr__->v1 = iVar5;
    __return_storage_ptr__->v2 = iVar6;
    *(undefined4 *)&__return_storage_ptr__->field_0xc = uVar7;
    std::priority_queue<Edge,_std::vector<Edge,_std::allocator<Edge>_>,_EdgeHeap::cmp>::pop
              (&this->pq);
  }
  return __return_storage_ptr__;
}

Assistant:

Edge EdgeHeap::getMinCost(){
	if(pq.size() <= 0){
		return Edge(0,0);
	}
	while(isDeleted[pq.top().id]){
		pq.pop();
	}
	Edge e = pq.top();
	pq.pop();
	return e;
}